

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_speed.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  time_t tVar2;
  time_t tVar3;
  long lVar4;
  bool bVar5;
  size_t oBufSz;
  char **voidsux;
  char **voidsux_2;
  size_t tBufSz;
  uchar iBuf [4096];
  char obuff [8192];
  
  srand(0xb);
  for (lVar4 = 0; lVar4 != 0x1000; lVar4 = lVar4 + 1) {
    iVar1 = rand();
    iBuf[lVar4] = (uchar)iVar1;
  }
  tVar2 = time((time_t *)0x0);
  iVar1 = 0x280000;
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    oBufSz = 0x2000;
    voidsux = (char **)obuff;
    zt_base_encode(zt_base64_rfc,iBuf,0x1000,&voidsux,&oBufSz);
  }
  tVar3 = time((time_t *)0x0);
  printf("zt64 Encoding :        %lld gigs in %ld seconds.\n",10,tVar3 - tVar2);
  oBufSz = 0x2000;
  voidsux = (char **)obuff;
  zt_base_encode(zt_base64_rfc,iBuf,0x1000,&voidsux,&oBufSz);
  tVar2 = time((time_t *)0x0);
  iVar1 = 0x280000;
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    tBufSz = 0x2000;
    voidsux_2 = (char **)iBuf;
    zt_base_decode(zt_base64_rfc,obuff,oBufSz,&voidsux_2,&tBufSz);
  }
  tVar3 = time((time_t *)0x0);
  printf("zt64 Decoding:          %lld gigs in %ld seconds.\n",10,tVar3 - tVar2);
  return 0;
}

Assistant:

int
main(int argc, char **argv) {
    test_base64_speed();
    return 0;
}